

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O3

void __thiscall
Assimp::StreamReader<false,_false>::StreamReader
          (StreamReader<false,_false> *this,shared_ptr<Assimp::IOStream> *stream,bool le)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (stream->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (stream->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->le = le;
  if ((stream->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    InternBegin(this);
    return;
  }
  __assert_fail("stream",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StreamReader.h"
                ,0x62,
                "Assimp::StreamReader<>::StreamReader(std::shared_ptr<IOStream>, bool) [SwapEndianess = false, RuntimeSwitch = false]"
               );
}

Assistant:

StreamReader(std::shared_ptr<IOStream> stream, bool le = false)
        : stream(stream)
        , le(le)
    {
        ai_assert(stream);
        InternBegin();
    }